

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
Parser::parseLabel(Parser *this)

{
  bool bVar1;
  Token *this_00;
  Token *pTVar2;
  Identifier *__v;
  pointer *__ptr;
  Parser *in_RSI;
  undefined1 local_68 [8];
  Identifier local_60;
  string local_40;
  
  updateFileInfo(in_RSI);
  this_00 = peekToken(in_RSI,0);
  pTVar2 = peekToken(in_RSI,0);
  if ((pTVar2->type == Identifier) && (pTVar2 = peekToken(in_RSI,1), pTVar2->type == Colon)) {
    __v = Token::identifierValue(this_00);
    eatTokens(in_RSI,2);
    if (in_RSI->initializingMacro == true) {
      std::
      _Rb_tree<Identifier,Identifier,std::_Identity<Identifier>,std::less<Identifier>,std::allocator<Identifier>>
      ::_M_insert_unique<Identifier_const&>
                ((_Rb_tree<Identifier,Identifier,std::_Identity<Identifier>,std::less<Identifier>,std::allocator<Identifier>>
                  *)&in_RSI->macroLabels,__v);
    }
    bVar1 = SymbolTable::isValidSymbolName(__v);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_40,(string *)&this_00->originalText);
      Identifier::Identifier(&local_60,&local_40);
      std::make_unique<CAssemblerLabel,Identifier_const&,Identifier>((Identifier *)local_68,__v);
      (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_68;
      local_68 = (undefined1  [8])0x0;
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_40);
      return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>
             )(__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>
               )this;
    }
    printError<Identifier>(in_RSI,this_00,"Invalid label name \"%s\"",__v);
  }
  (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> Parser::parseLabel()
{
	updateFileInfo();

	const Token& start = peekToken(0);

	if (peekToken(0).type == TokenType::Identifier &&
		peekToken(1).type == TokenType::Colon)
	{
		const Identifier &name = start.identifierValue();
		eatTokens(2);
		
		if (initializingMacro)
			macroLabels.insert(name);
		
		if (!Global.symbolTable.isValidSymbolName(name))
		{
			printError(start, "Invalid label name \"%s\"",name);
			return nullptr;
		}

		return std::make_unique<CAssemblerLabel>(name,Identifier(start.getOriginalText()));
	}

	return nullptr;
}